

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestHandlerCommand::InitialPass
          (cmCTestHandlerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  string_view view;
  bool bVar3;
  byte bVar4;
  int iVar5;
  iterator __first;
  reference pbVar6;
  reference str;
  string *psVar7;
  char *pcVar8;
  ostream *poVar9;
  ulong uVar10;
  undefined4 extraout_var;
  string_view local_1228;
  string local_1218 [32];
  undefined1 local_11f8 [8];
  ostringstream cmCTestLog_msg_7;
  string *err_2;
  char *returnString;
  string_view local_1050;
  int local_103c;
  string local_1038 [4];
  int res;
  string local_1018 [32];
  undefined1 local_ff8 [8];
  ostringstream cmCTestLog_msg_6;
  string_view local_e80;
  allocator<char> local_e69;
  string local_e68;
  string local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  allocator<char> local_dc1;
  string local_dc0;
  string local_da0;
  undefined1 local_d80 [8];
  cmWorkingDirectory workdir;
  undefined1 local_d38 [8];
  ostringstream cmCTestLog_msg_5;
  string *err_1;
  string local_ba8 [32];
  string local_b88 [32];
  undefined1 local_b68 [8];
  ostringstream cmCTestLog_msg_4;
  cmCTestGenericHandler *handler;
  undefined1 local_9c8 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_849;
  string local_848;
  cmValue local_828;
  cmValue changeId;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8 [32];
  undefined1 local_798 [8];
  ostringstream cmCTestLog_msg_2;
  string local_620 [32];
  undefined1 local_600 [8];
  ostringstream cmCTestLog_msg_1;
  string local_488;
  allocator<char> local_461;
  string local_460;
  string *local_440;
  string *bdir;
  allocator<char> local_411;
  string local_410;
  cmValue local_3f0;
  cmValue ctestConfigType;
  string local_3e0 [32];
  undefined1 local_3c0 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string err;
  undefined1 local_1d0 [7];
  bool captureCMakeError;
  cmAlphaNum local_1a0;
  string local_170;
  byte local_149;
  size_t sStack_148;
  bool foundBadArgument;
  char *pcStack_140;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  string local_d8;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_b8;
  basic_string_view<char,_std::char_traits<char>_> *local_b0;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_a8;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_a0;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  it;
  ParseResult local_88;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  SaveRestoreErrorState local_2a;
  cmExecutionStatus *pcStack_28;
  SaveRestoreErrorState errorState;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestHandlerCommand *this_local;
  cmCTestGenericHandler *this_00;
  
  pcStack_28 = status;
  anon_unknown.dwarf_3840f3::SaveRestoreErrorState::SaveRestoreErrorState(&local_2a);
  (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[7])();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_88,&this->super_cmArgumentParser<void>,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,0);
  ArgumentParser::ParseResult::~ParseResult(&local_88);
  (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[8])();
  __first = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::begin(&this->ParsedKeywords);
  it._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end(&this->ParsedKeywords);
  std::
  sort<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
            ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              )__first._M_current,it);
  local_a8._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin(&this->ParsedKeywords);
  local_b0 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end(&this->ParsedKeywords);
  local_a0 = std::
             adjacent_find<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                       (local_a8,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  )local_b0);
  local_b8._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::end(&this->ParsedKeywords);
  bVar3 = __gnu_cxx::operator!=(&local_a0,&local_b8);
  if (bVar3) {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    cmAlphaNum::cmAlphaNum(&local_108,"Called with more than one value for ");
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&local_a0);
    sStack_148 = pbVar6->_M_len;
    pcStack_140 = pbVar6->_M_str;
    view._M_len = pbVar6->_M_len;
    view._M_str = pbVar6->_M_str;
    cmAlphaNum::cmAlphaNum(&local_138,view);
    cmStrCat<>(&local_d8,&local_108,&local_138);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
  local_149 = (bVar3 ^ 0xffU) & 1;
  if (local_149 != 0) {
    cmAlphaNum::cmAlphaNum(&local_1a0,"called with unknown argument \"");
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_1d0,str);
    cmStrCat<char[3]>(&local_170,&local_1a0,(cmAlphaNum *)local_1d0,(char (*) [3])0xd299d5);
    cmCommand::SetError((cmCommand *)this,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
  }
  bVar4 = std::__cxx11::string::empty();
  bVar4 = (bVar4 ^ 0xff) & 1;
  if (bVar4 != 0) {
    anon_unknown.dwarf_3840f3::SaveRestoreErrorState::CaptureCMakeError(&local_2a);
  }
  if ((local_149 & 1) == 0) {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"CTEST_CONFIGURATION_TYPE",&local_411);
    local_3f0 = cmMakefile::GetDefinition(pcVar1,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    bVar3 = cmValue::operator_cast_to_bool(&local_3f0);
    if (bVar3) {
      pcVar2 = (this->super_cmCTestCommand).CTest;
      psVar7 = cmValue::operator*[abi_cxx11_(&local_3f0);
      cmCTest::SetConfigType(pcVar2,psVar7);
    }
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pcVar2 = (this->super_cmCTestCommand).CTest;
      cmsys::SystemTools::CollapseFullPath((string *)&bdir,&this->Build);
      cmCTest::SetCTestConfiguration
                (pcVar2,"BuildDirectory",(string *)&bdir,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string((string *)&bdir);
    }
    else {
      pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"CTEST_BINARY_DIRECTORY",&local_461);
      psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator(&local_461);
      local_440 = psVar7;
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        pcVar2 = (this->super_cmCTestCommand).CTest;
        cmsys::SystemTools::CollapseFullPath(&local_488,local_440);
        cmCTest::SetCTestConfiguration(pcVar2,"BuildDirectory",&local_488,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&local_488);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_600);
        poVar9 = std::operator<<((ostream *)local_600,"CTEST_BINARY_DIRECTORY not set");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                     ,0x92,pcVar8,false);
        std::__cxx11::string::~string(local_620);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_600);
      }
    }
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
      poVar9 = std::operator<<((ostream *)local_798,"Set source directory to: ");
      poVar9 = std::operator<<(poVar9,(string *)&this->Source);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x97,pcVar8,false);
      std::__cxx11::string::~string(local_7b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      cmsys::SystemTools::CollapseFullPath(&local_7d8,&this->Source);
      cmCTest::SetCTestConfiguration(pcVar2,"SourceDirectory",&local_7d8,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string((string *)&local_7d8);
    }
    else {
      pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,"CTEST_SOURCE_DIRECTORY",
                 (allocator<char> *)((long)&changeId.Value + 7));
      psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_818);
      cmsys::SystemTools::CollapseFullPath(&local_7f8,psVar7);
      cmCTest::SetCTestConfiguration(pcVar2,"SourceDirectory",&local_7f8,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator((allocator<char> *)((long)&changeId.Value + 7));
    }
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,"CTEST_CHANGE_ID",&local_849);
    local_828 = cmMakefile::GetDefinition(pcVar1,&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator(&local_849);
    bVar3 = cmValue::operator_cast_to_bool(&local_828);
    if (bVar3) {
      pcVar2 = (this->super_cmCTestCommand).CTest;
      psVar7 = cmValue::operator*[abi_cxx11_(&local_828);
      cmCTest::SetCTestConfiguration(pcVar2,"ChangeId",psVar7,(bool)(this->Quiet & 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9c8);
    poVar9 = std::operator<<((ostream *)local_9c8,"Initialize handler");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestCommand).CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                 ,0xa7,pcVar8,false);
    std::__cxx11::string::~string((string *)&handler);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9c8);
    iVar5 = (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[5])();
    this_00 = (cmCTestGenericHandler *)CONCAT44(extraout_var,iVar5);
    if (this_00 == (cmCTestGenericHandler *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b68);
      poVar9 = std::operator<<((ostream *)local_b68,"Cannot instantiate test handler ");
      (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(local_b88);
      poVar9 = std::operator<<(poVar9,local_b88);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_b88);
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0xac,pcVar8,false);
      std::__cxx11::string::~string(local_ba8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b68);
      if (bVar4 == 0) {
        this_local._7_1_ = false;
        ctestConfigType.Value._4_4_ = 1;
      }
      else {
        pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&err_1,"-1");
        cmMakefile::AddDefinition(pcVar1,&this->CaptureCMakeError,_err_1);
        psVar7 = cmExecutionStatus::GetError_abi_cxx11_(pcStack_28);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        pcVar8 = cmsys::SystemTools::FindLastString(pcVar8,"unknown error.");
        if (pcVar8 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d38);
          poVar9 = std::operator<<((ostream *)local_d38,(string *)psVar7);
          std::operator<<(poVar9," error from command\n");
          pcVar2 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                       ,0xb1,pcVar8,false);
          std::__cxx11::string::~string((string *)&workdir.ResultCode);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d38);
        }
        this_local._7_1_ = true;
        ctestConfigType.Value._4_4_ = 1;
      }
    }
    else {
      cmCTestGenericHandler::SetAppendXML(this_00,(bool)(this->Append & 1));
      (**this_00->_vptr_cmCTestGenericHandler)
                (this_00,(this->super_cmCTestCommand).super_cmCommand.Makefile);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar5 = atoi(pcVar8);
        cmCTestGenericHandler::SetSubmitIndex(this_00,iVar5);
      }
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_dc0,"BuildDirectory",&local_dc1);
      cmCTest::GetCTestConfiguration(&local_da0,pcVar2,&local_dc0);
      cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_d80,&local_da0);
      std::__cxx11::string::~string((string *)&local_da0);
      std::__cxx11::string::~string((string *)&local_dc0);
      std::allocator<char>::~allocator(&local_dc1);
      bVar3 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_d80);
      if (bVar3) {
        pcVar2 = (this->super_cmCTestCommand).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e68,"BuildDirectory",&local_e69);
        cmCTest::GetCTestConfiguration(&local_e48,pcVar2,&local_e68);
        std::operator+(&local_e28,"failed to change directory to ",&local_e48);
        std::operator+(&local_e08,&local_e28," : ");
        iVar5 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_d80);
        pcVar8 = strerror(iVar5);
        std::operator+(&local_de8,&local_e08,pcVar8);
        cmCommand::SetError((cmCommand *)this,&local_de8);
        std::__cxx11::string::~string((string *)&local_de8);
        std::__cxx11::string::~string((string *)&local_e08);
        std::__cxx11::string::~string((string *)&local_e28);
        std::__cxx11::string::~string((string *)&local_e48);
        std::__cxx11::string::~string((string *)&local_e68);
        std::allocator<char>::~allocator(&local_e69);
        if (bVar4 == 0) {
          this_local._7_1_ = false;
        }
        else {
          pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e80,"-1");
          cmMakefile::AddDefinition(pcVar1,&this->CaptureCMakeError,local_e80);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ff8);
          (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(local_1018);
          poVar9 = std::operator<<((ostream *)local_ff8,local_1018);
          poVar9 = std::operator<<(poVar9," ");
          psVar7 = cmExecutionStatus::GetError_abi_cxx11_(pcStack_28);
          poVar9 = std::operator<<(poVar9,(string *)psVar7);
          std::operator<<(poVar9,"\n");
          std::__cxx11::string::~string(local_1018);
          pcVar2 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                       ,199,pcVar8,false);
          std::__cxx11::string::~string(local_1038);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ff8);
          this_local._7_1_ = true;
        }
      }
      else {
        local_103c = (*this_00->_vptr_cmCTestGenericHandler[1])();
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          std::__cxx11::to_string((string *)&returnString,local_103c);
          local_1050 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&returnString);
          cmMakefile::AddDefinition(pcVar1,&this->ReturnValue,local_1050);
          std::__cxx11::string::~string((string *)&returnString);
        }
        (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[6])(this,this_00);
        if (bVar4 != 0) {
          err_2 = (string *)0xd4a2d3;
          bVar3 = cmSystemTools::GetErrorOccurredFlag();
          if (bVar3) {
            err_2 = (string *)0xdb599f;
            psVar7 = cmExecutionStatus::GetError_abi_cxx11_(pcStack_28);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            pcVar8 = cmsys::SystemTools::FindLastString(pcVar8,"unknown error.");
            if (pcVar8 == (char *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11f8);
              std::operator<<((ostream *)local_11f8,(string *)psVar7);
              pcVar2 = (this->super_cmCTestCommand).CTest;
              std::__cxx11::ostringstream::str();
              pcVar8 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                           ,0xdc,pcVar8,false);
              std::__cxx11::string::~string(local_1218);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11f8);
            }
          }
          pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1228,(char *)err_2);
          cmMakefile::AddDefinition(pcVar1,&this->CaptureCMakeError,local_1228);
        }
        this_local._7_1_ = true;
      }
      ctestConfigType.Value._4_4_ = 1;
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_d80);
    }
  }
  else if (bVar4 == 0) {
    this_local._7_1_ = false;
    ctestConfigType.Value._4_4_ = 1;
  }
  else {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&err.field_2 + 8),"-1");
    cmMakefile::AddDefinition(pcVar1,&this->CaptureCMakeError,stack0xfffffffffffffe18);
    (*(this->super_cmCTestCommand).super_cmCommand._vptr_cmCommand[4])(&local_248);
    std::operator+(&local_228,&local_248," ");
    psVar7 = cmExecutionStatus::GetError_abi_cxx11_(pcStack_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &local_228,psVar7);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar8 = cmsys::SystemTools::FindLastString(pcVar8,"unknown error.");
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c0);
      poVar9 = std::operator<<((ostream *)local_3c0,(string *)local_208);
      std::operator<<(poVar9," error from command\n");
      pcVar2 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x73,pcVar8,false);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c0);
    }
    this_local._7_1_ = true;
    ctestConfigType.Value._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_208);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  anon_unknown.dwarf_3840f3::SaveRestoreErrorState::~SaveRestoreErrorState(&local_2a);
  return this_local._7_1_;
}

Assistant:

bool cmCTestHandlerCommand::InitialPass(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  // save error state and restore it if needed
  SaveRestoreErrorState errorState;
  // Allocate space for argument values.
  this->BindArguments();

  // Process input arguments.
  std::vector<std::string> unparsedArguments;
  this->Parse(args, &unparsedArguments);
  this->CheckArguments();

  std::sort(this->ParsedKeywords.begin(), this->ParsedKeywords.end());
  auto it = std::adjacent_find(this->ParsedKeywords.begin(),
                               this->ParsedKeywords.end());
  if (it != this->ParsedKeywords.end()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Called with more than one value for ", *it));
  }

  bool const foundBadArgument = !unparsedArguments.empty();
  if (foundBadArgument) {
    this->SetError(cmStrCat("called with unknown argument \"",
                            unparsedArguments.front(), "\"."));
  }
  bool const captureCMakeError = !this->CaptureCMakeError.empty();
  // now that arguments are parsed check to see if there is a
  // CAPTURE_CMAKE_ERROR specified let the errorState object know.
  if (captureCMakeError) {
    errorState.CaptureCMakeError();
  }
  // if we found a bad argument then exit before running command
  if (foundBadArgument) {
    // store the cmake error
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      std::string const err = this->GetName() + " " + status.GetError();
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err << " error from command\n");
      }
      // return success because failure is recorded in CAPTURE_CMAKE_ERROR
      return true;
    }
    // return failure because of bad argument
    return false;
  }

  // Set the config type of this ctest to the current value of the
  // CTEST_CONFIGURATION_TYPE script variable if it is defined.
  // The current script value trumps the -C argument on the command
  // line.
  cmValue ctestConfigType =
    this->Makefile->GetDefinition("CTEST_CONFIGURATION_TYPE");
  if (ctestConfigType) {
    this->CTest->SetConfigType(*ctestConfigType);
  }

  if (!this->Build.empty()) {
    this->CTest->SetCTestConfiguration(
      "BuildDirectory", cmSystemTools::CollapseFullPath(this->Build),
      this->Quiet);
  } else {
    std::string const& bdir =
      this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");
    if (!bdir.empty()) {
      this->CTest->SetCTestConfiguration(
        "BuildDirectory", cmSystemTools::CollapseFullPath(bdir), this->Quiet);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "CTEST_BINARY_DIRECTORY not set" << std::endl;);
    }
  }
  if (!this->Source.empty()) {
    cmCTestLog(this->CTest, DEBUG,
               "Set source directory to: " << this->Source << std::endl);
    this->CTest->SetCTestConfiguration(
      "SourceDirectory", cmSystemTools::CollapseFullPath(this->Source),
      this->Quiet);
  } else {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY")),
      this->Quiet);
  }

  if (cmValue changeId = this->Makefile->GetDefinition("CTEST_CHANGE_ID")) {
    this->CTest->SetCTestConfiguration("ChangeId", *changeId, this->Quiet);
  }

  cmCTestLog(this->CTest, DEBUG, "Initialize handler" << std::endl;);
  cmCTestGenericHandler* handler = this->InitializeHandler();
  if (!handler) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot instantiate test handler " << this->GetName()
                                                  << std::endl);
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      std::string const& err = status.GetError();
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err << " error from command\n");
      }
      return true;
    }
    return false;
  }

  handler->SetAppendXML(this->Append);

  handler->PopulateCustomVectors(this->Makefile);
  if (!this->SubmitIndex.empty()) {
    handler->SetSubmitIndex(atoi(this->SubmitIndex.c_str()));
  }
  cmWorkingDirectory workdir(
    this->CTest->GetCTestConfiguration("BuildDirectory"));
  if (workdir.Failed()) {
    this->SetError("failed to change directory to " +
                   this->CTest->GetCTestConfiguration("BuildDirectory") +
                   " : " + std::strerror(workdir.GetLastResult()));
    if (captureCMakeError) {
      this->Makefile->AddDefinition(this->CaptureCMakeError, "-1");
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 this->GetName() << " " << status.GetError() << "\n");
      // return success because failure is recorded in CAPTURE_CMAKE_ERROR
      return true;
    }
    return false;
  }

  int res = handler->ProcessHandler();
  if (!this->ReturnValue.empty()) {
    this->Makefile->AddDefinition(this->ReturnValue, std::to_string(res));
  }
  this->ProcessAdditionalValues(handler);
  // log the error message if there was an error
  if (captureCMakeError) {
    const char* returnString = "0";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      returnString = "-1";
      std::string const& err = status.GetError();
      // print out the error if it is not "unknown error" which means
      // there was no message
      if (!cmSystemTools::FindLastString(err.c_str(), "unknown error.")) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, err);
      }
    }
    // store the captured cmake error state 0 or -1
    this->Makefile->AddDefinition(this->CaptureCMakeError, returnString);
  }
  return true;
}